

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.cc
# Opt level: O3

bool google::protobuf::internal::anon_unknown_15::UnknownFieldHandlerLite::Skip
               (MessageLite *msg,ParseTable *table,CodedInputStream *input,int tag)

{
  ulong uVar1;
  bool bVar2;
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target;
  undefined1 local_90 [8];
  CodedOutputStream unknown_fields_stream;
  StringOutputStream unknown_fields_string;
  
  if (table->unknown_field_set == true) {
    LogMessage::LogMessage
              ((LogMessage *)local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/generated_message_table_driven_lite.cc"
               ,0x3a);
    other = LogMessage::operator<<
                      ((LogMessage *)local_90,"CHECK failed: !table.unknown_field_set: ");
    LogFinisher::operator=((LogFinisher *)&unknown_fields_stream.start_count_,other);
    LogMessage::~LogMessage((LogMessage *)local_90);
  }
  uVar1 = *(ulong *)((long)&msg->_vptr_MessageLite + table->arena_offset);
  if ((uVar1 & 1) == 0) {
    target = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
                       ((InternalMetadata *)((long)&msg->_vptr_MessageLite + table->arena_offset));
  }
  else {
    target = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((uVar1 & 0xfffffffffffffffe) + 8);
  }
  io::StringOutputStream::StringOutputStream
            ((StringOutputStream *)&unknown_fields_stream.start_count_,target);
  io::CodedOutputStream::CodedOutputStream
            ((CodedOutputStream *)local_90,
             (ZeroCopyOutputStream *)&unknown_fields_stream.start_count_,false);
  bVar2 = WireFormatLite::SkipField(input,tag,(CodedOutputStream *)local_90);
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_90);
  return bVar2;
}

Assistant:

static bool Skip(MessageLite* msg, const ParseTable& table,
                   io::CodedInputStream* input, int tag) {
    GOOGLE_DCHECK(!table.unknown_field_set);
    io::StringOutputStream unknown_fields_string(
        MutableUnknownFields(msg, table.arena_offset));
    io::CodedOutputStream unknown_fields_stream(&unknown_fields_string, false);

    return internal::WireFormatLite::SkipField(input, tag,
                                               &unknown_fields_stream);
  }